

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  int *piVar1;
  int iVar2;
  ImDrawCmd *pIVar3;
  ImTextureID pvVar4;
  undefined8 uVar5;
  ImDrawCallback p_Var6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImDrawCmd *pIVar12;
  
  if (this->Size == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar12 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar12,this->Data,(long)this->Size * 0x38);
        pIVar3 = this->Data;
        if ((pIVar3 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      this->Data = pIVar12;
      this->Capacity = 8;
    }
    pIVar12 = this->Data;
    iVar2 = this->Size;
    pIVar12[iVar2].UserCallbackData = v->UserCallbackData;
    fVar8 = (v->ClipRect).x;
    fVar9 = (v->ClipRect).y;
    fVar10 = (v->ClipRect).z;
    fVar11 = (v->ClipRect).w;
    pvVar4 = v->TextureId;
    uVar5 = *(undefined8 *)&v->VtxOffset;
    uVar7 = *(undefined4 *)&v->field_0x24;
    p_Var6 = v->UserCallback;
    pIVar3 = pIVar12 + iVar2;
    pIVar3->ElemCount = v->ElemCount;
    *(undefined4 *)&pIVar3->field_0x24 = uVar7;
    *(ImDrawCallback *)(&pIVar3->ElemCount + 2) = p_Var6;
    pIVar12[iVar2].TextureId = pvVar4;
    (&pIVar12[iVar2].TextureId)[1] = (ImTextureID)uVar5;
    pIVar12 = pIVar12 + iVar2;
    (pIVar12->ClipRect).x = fVar8;
    (pIVar12->ClipRect).y = fVar9;
    (pIVar12->ClipRect).z = fVar10;
    (pIVar12->ClipRect).w = fVar11;
    this->Size = this->Size + 1;
    return;
  }
  insert(this,this->Data,v);
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }